

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * chaiscript::exception::eval_error::startpos<std::shared_ptr<chaiscript::AST_Node_const>>
                   (shared_ptr<const_chaiscript::AST_Node> *t)

{
  element_type *peVar1;
  File_Position *pFVar2;
  ostream *poVar3;
  string *in_RDI;
  ostringstream oss;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  peVar1 = std::
           __shared_ptr_access<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3c707b);
  pFVar2 = AST_Node::start(peVar1);
  poVar3 = (ostream *)std::ostream::operator<<(local_188,pFVar2->line);
  poVar3 = std::operator<<(poVar3,", ");
  peVar1 = std::
           __shared_ptr_access<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3c70c7);
  pFVar2 = AST_Node::start(peVar1);
  std::ostream::operator<<(poVar3,pFVar2->column);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string startpos(const T& t)
        {
          std::ostringstream oss;
          oss << t->start().line << ", " << t->start().column;
          return oss.str();
        }